

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O3

int __thiscall
glcts::TessellationShaderQuadsTests::init(TessellationShaderQuadsTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParam;
  int extraout_EAX;
  TestCaseBase *pTVar1;
  
  pTVar1 = (TestCaseBase *)operator_new(0x2d8);
  extParam = &(this->super_TestCaseGroupBase).m_extParams;
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"degenerate_case",
             "Verifies that only a single triangle pair covering the outer rectangle is generated, if both clamped inner and outer tessellation levels are set to one."
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderQuadsDegenerateCase_02108388;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2d8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,
             "inner_tessellation_level_rounding",
             "Verifies that either inner tessellation level is rounded to 2 or 3, when the tessellator is run in quads primitive mode and corresponding inner tessellation level is set to 1."
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderQuadsInnerTessellationLevelRounding_021083c0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void TessellationShaderQuadsTests::init(void)
{
	addChild(new glcts::TessellationShaderQuadsDegenerateCase(m_context, m_extParams));
	addChild(new glcts::TessellationShaderQuadsInnerTessellationLevelRounding(m_context, m_extParams));
}